

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int InjectFlushOrPushOutput
              (BrotliEncoderState *s,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  size_t local_50;
  size_t copy_output_size;
  size_t *total_out_local;
  uint8_t **next_out_local;
  size_t *available_out_local;
  BrotliEncoderState *s_local;
  
  if ((s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED) && (s->last_bytes_bits_ != '\0')) {
    InjectBytePaddingBlock(s);
    s_local._4_4_ = 1;
  }
  else if ((s->available_out_ == 0) || (*available_out == 0)) {
    s_local._4_4_ = 0;
  }
  else {
    local_50 = *available_out;
    if (s->available_out_ < local_50) {
      local_50 = s->available_out_;
    }
    memcpy(*next_out,s->next_out_,local_50);
    *next_out = *next_out + local_50;
    *available_out = *available_out - local_50;
    s->next_out_ = s->next_out_ + local_50;
    s->available_out_ = s->available_out_ - local_50;
    s->total_out_ = local_50 + s->total_out_;
    if (total_out != (size_t *)0x0) {
      *total_out = s->total_out_;
    }
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static BROTLI_BOOL InjectFlushOrPushOutput(BrotliEncoderState* s,
    size_t* available_out, uint8_t** next_out, size_t* total_out) {
  if (s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED &&
      s->last_bytes_bits_ != 0) {
    InjectBytePaddingBlock(s);
    return BROTLI_TRUE;
  }

  if (s->available_out_ != 0 && *available_out != 0) {
    size_t copy_output_size =
        BROTLI_MIN(size_t, s->available_out_, *available_out);
    memcpy(*next_out, s->next_out_, copy_output_size);
    *next_out += copy_output_size;
    *available_out -= copy_output_size;
    s->next_out_ += copy_output_size;
    s->available_out_ -= copy_output_size;
    s->total_out_ += copy_output_size;
    if (total_out) *total_out = s->total_out_;
    return BROTLI_TRUE;
  }

  return BROTLI_FALSE;
}